

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O2

void __thiscall
MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers
          (MockNamedValueComparatorsAndCopiersRepository *this,
          MockNamedValueComparatorsAndCopiersRepository *repository)

{
  MockNamedValueComparatorsAndCopiersRepositoryNode *pMVar1;
  MockNamedValueComparator *pMVar2;
  MockNamedValueCopier *pMVar3;
  MockNamedValueComparatorsAndCopiersRepositoryNode *this_00;
  SimpleString *pSVar4;
  
  for (pSVar4 = (SimpleString *)&repository->head_; pSVar4 = (SimpleString *)pSVar4->buffer_,
      pSVar4 != (SimpleString *)0x0; pSVar4 = pSVar4 + 2) {
    this_00 = (MockNamedValueComparatorsAndCopiersRepositoryNode *)
              operator_new(0x28,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                           ,0x295);
    pMVar2 = (MockNamedValueComparator *)pSVar4[1].buffer_;
    pMVar3 = (MockNamedValueCopier *)pSVar4[1].bufferSize_;
    pMVar1 = this->head_;
    SimpleString::SimpleString((SimpleString *)this_00,pSVar4);
    this_00->comparator_ = pMVar2;
    this_00->copier_ = pMVar3;
    this_00->next_ = pMVar1;
    this->head_ = this_00;
  }
  return;
}

Assistant:

void MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers(const MockNamedValueComparatorsAndCopiersRepository& repository)
{
    for (MockNamedValueComparatorsAndCopiersRepositoryNode* p = repository.head_; p; p = p->next_)
      head_ = new MockNamedValueComparatorsAndCopiersRepositoryNode(p->name_, p->comparator_, p->copier_, head_);
}